

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void charls::transform_triplet_to_line<charls::transform_hp3<unsigned_char>,unsigned_char>
               (triplet<unsigned_char> *source,size_t pixel_stride_in,uchar *destination,
               size_t pixel_stride,transform_hp3<unsigned_char> *transform,uint32_t mask)

{
  byte bVar1;
  byte bVar2;
  anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 *paVar3;
  size_t sVar4;
  byte bVar5;
  
  if (pixel_stride <= pixel_stride_in) {
    pixel_stride_in = pixel_stride;
  }
  if (pixel_stride_in != 0) {
    paVar3 = &source->field_2;
    sVar4 = 0;
    do {
      bVar5 = (byte)mask;
      bVar1 = ((anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 *)(paVar3 + -1))->v2 & bVar5;
      bVar2 = ((paVar3->v3 & bVar5) - bVar1) + 0x80;
      bVar5 = (((((triplet<unsigned_char> *)(paVar3 + -2))->field_0).v1 & bVar5) - bVar1) + 0x80;
      destination[sVar4] = (char)((uint)bVar2 + (uint)bVar5 >> 2) + bVar1 + 0xc0;
      destination[sVar4 + pixel_stride] = bVar2;
      destination[sVar4 + pixel_stride * 2] = bVar5;
      sVar4 = sVar4 + 1;
      paVar3 = paVar3 + 3;
    } while (pixel_stride_in != sVar4);
  }
  return;
}

Assistant:

void transform_triplet_to_line(const triplet<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                               const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    const triplet<PixelType>* type_buffer_in{source};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const triplet<PixelType> color{type_buffer_in[i]};
        const triplet<PixelType> color_transformed{transform(color.v1 & mask, color.v2 & mask, color.v3 & mask)};

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
    }
}